

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_fast_force(char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  U16 UVar1;
  U16 UVar2;
  uint uVar3;
  U32 UVar4;
  U32 UVar5;
  reg_t rVar6;
  reg_t rVar7;
  int iVar8;
  BYTE *pBVar9;
  bool bVar10;
  U32 local_4f40;
  tableType_t addrMode;
  LZ4_stream_t ctx;
  int local_f18;
  int acceleration_local;
  int dstCapacity_local;
  int srcSize_local;
  char *dst_local;
  char *src_local;
  ulong local_ef8;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  int local_e90;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *pBStack_de8;
  U32 startIndex_1;
  BYTE *ip_1;
  int local_dd8;
  int result_1;
  int local_dd0;
  tableType_t local_dcc;
  int local_dc8;
  int local_dc4;
  int *local_dc0;
  int local_db4;
  BYTE *local_db0;
  LZ4_stream_t_internal *local_da8;
  U32 *local_da0;
  int local_d94;
  ulong local_d90;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  int local_d28;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *pBStack_c80;
  U32 startIndex;
  BYTE *ip;
  int local_c70;
  int result;
  int local_c68;
  tableType_t local_c64;
  int local_c60;
  int local_c5c;
  int *local_c58;
  int local_c4c;
  BYTE *local_c48;
  LZ4_stream_t_internal *local_c40;
  U32 *local_c38;
  int local_c30;
  uint local_c2c;
  BYTE **ppBStack_c28;
  U32 h_6;
  tableType_t local_c1c;
  U32 *local_c18;
  BYTE *local_c10;
  uint local_c04;
  BYTE **ppBStack_c00;
  U32 h_4;
  tableType_t local_bf4;
  U32 *local_bf0;
  BYTE *local_be8;
  uint local_bdc;
  BYTE **ppBStack_bd8;
  U32 h;
  undefined4 local_bcc;
  U32 *local_bc8;
  char *local_bc0;
  uint local_bb4;
  BYTE **ppBStack_bb0;
  U32 h_14;
  tableType_t local_ba4;
  U32 *local_ba0;
  BYTE *local_b98;
  uint local_b8c;
  BYTE **ppBStack_b88;
  U32 h_12;
  tableType_t local_b7c;
  U32 *local_b78;
  BYTE *local_b70;
  uint local_b64;
  BYTE **ppBStack_b60;
  U32 h_8;
  undefined4 local_b54;
  U32 *local_b50;
  char *local_b48;
  int local_b3c;
  char *local_b38;
  uint local_b30;
  tableType_t local_b2c;
  BYTE *local_b28;
  uint local_b20;
  tableType_t local_b1c;
  BYTE *local_b18;
  uint local_b10;
  int local_b0c;
  char *local_b08;
  uint local_b00;
  tableType_t local_afc;
  BYTE *local_af8;
  uint local_af0;
  tableType_t local_aec;
  BYTE *local_ae8;
  uint local_ae0;
  tableType_t local_adc;
  BYTE *local_ad8;
  uint local_ad0;
  tableType_t local_acc;
  BYTE *local_ac8;
  uint local_ac0;
  tableType_t local_abc;
  BYTE *local_ab8;
  uint local_ab0;
  tableType_t local_aac;
  BYTE *local_aa8;
  uint local_aa0;
  tableType_t local_a9c;
  BYTE *local_a98;
  uint local_a90;
  tableType_t local_a8c;
  BYTE *local_a88;
  uint local_a80;
  tableType_t local_a7c;
  BYTE *local_a78;
  uint local_a70;
  tableType_t local_a6c;
  BYTE *local_a68;
  uint local_a60;
  tableType_t local_a5c;
  BYTE *local_a58;
  uint local_a50;
  tableType_t local_a4c;
  BYTE *local_a48;
  uint local_a40;
  tableType_t local_a3c;
  BYTE *local_a38;
  uint local_a30;
  tableType_t local_a2c;
  BYTE *local_a28;
  uint local_a1c;
  U32 *local_a18;
  U16 *hashTable_29;
  U32 *hashTable_28;
  BYTE **hashTable_27;
  undefined4 local_9f4;
  U32 *local_9f0;
  uint local_9e4;
  char *local_9e0;
  U32 *local_9d8;
  U16 *hashTable_44;
  U32 *hashTable_43;
  BYTE **hashTable_42;
  tableType_t local_9b4;
  U32 *local_9b0;
  uint local_9a4;
  BYTE *local_9a0;
  U32 *local_998;
  U16 *hashTable_47;
  U32 *hashTable_46;
  BYTE **hashTable_45;
  tableType_t local_974;
  U32 *local_970;
  uint local_964;
  BYTE *local_960;
  U32 *local_958;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  undefined4 local_934;
  U32 *local_930;
  uint local_924;
  char *local_920;
  U32 *local_918;
  U16 *hashTable_17;
  U32 *hashTable_16;
  BYTE **hashTable_15;
  tableType_t local_8f4;
  U32 *local_8f0;
  uint local_8e4;
  BYTE *local_8e0;
  U32 *local_8d8;
  U16 *hashTable_20;
  U32 *hashTable_19;
  BYTE **hashTable_18;
  tableType_t local_8b4;
  U32 *local_8b0;
  uint local_8a4;
  BYTE *local_8a0;
  U32 *local_898;
  U16 *hashTable_5;
  U32 *hashTable_4;
  BYTE **hashTable_3;
  tableType_t local_874;
  U32 *local_870;
  uint local_864;
  BYTE *local_860;
  U32 *local_858;
  U16 *hashTable_32;
  U32 *hashTable_31;
  BYTE **hashTable_30;
  tableType_t local_834;
  U32 *local_830;
  uint local_824;
  BYTE *local_820;
  U16 *hashTable_9;
  U32 *hashTable_8;
  BYTE *local_800;
  uint local_7f8;
  uint local_7f4;
  U16 *hashTable_24;
  U32 *hashTable_23;
  BYTE *local_7d8;
  uint local_7d0;
  uint local_7cc;
  U32 *local_7c8;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U32 *local_7b0;
  uint local_7a8;
  uint local_7a4;
  U32 *local_7a0;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U32 *local_788;
  uint local_780;
  uint local_77c;
  U16 *hashTable_36;
  U32 *hashTable_35;
  BYTE *local_760;
  uint local_758;
  uint local_754;
  U16 *hashTable_51;
  U32 *hashTable_50;
  BYTE *local_738;
  uint local_730;
  uint local_72c;
  U32 *local_728;
  U16 *hashTable_49;
  U32 *hashTable_48;
  U32 *local_710;
  uint local_708;
  uint local_704;
  U32 *local_700;
  U16 *hashTable_34;
  U32 *hashTable_33;
  U32 *local_6e8;
  uint local_6e0;
  uint local_6dc;
  U32 *local_6d8;
  U16 *hashTable_26;
  U32 *hashTable_25;
  U32 *local_6c0;
  uint local_6b8;
  uint local_6b4;
  U32 *local_6b0;
  U16 *hashTable_11;
  U32 *hashTable_10;
  U32 *local_698;
  U32 local_690;
  uint local_68c;
  U32 *local_688;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U32 *local_670;
  uint local_668;
  uint local_664;
  U32 *local_660;
  U16 *hashTable_38;
  U32 *hashTable_37;
  U32 *local_648;
  U32 local_640;
  uint local_63c;
  ulong local_638;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  LZ4_stream_t_internal *local_618;
  BYTE *local_610;
  uint local_604;
  ulong local_600;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  BYTE *local_5e0;
  BYTE *local_5d8;
  uint local_5cc;
  ulong local_5c8;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  BYTE *local_5a8;
  BYTE *local_5a0;
  uint local_594;
  ulong local_590;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  LZ4_stream_t_internal *local_570;
  BYTE *local_568;
  uint local_55c;
  ulong local_558;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  BYTE *local_538;
  BYTE *local_530;
  uint local_524;
  ulong local_520;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  BYTE *local_500;
  BYTE *local_4f8;
  uint local_4ec;
  U32 *local_4e8;
  U16 *hashTable_14;
  U32 *hashTable_13;
  BYTE **hashTable_12;
  U32 *local_4c8;
  uint local_4bc;
  U32 *local_4b8;
  U16 *hashTable_41;
  U32 *hashTable_40;
  BYTE **hashTable_39;
  U32 *local_498;
  uint local_490;
  U32 local_48c;
  BYTE *pBStack_488;
  U32 h_5;
  tableType_t local_47c;
  U32 *local_478;
  BYTE *local_470;
  tableType_t local_464;
  BYTE *local_460;
  U32 local_458;
  U32 local_454;
  BYTE *pBStack_450;
  U32 h_13;
  tableType_t local_444;
  U32 *local_440;
  BYTE *local_438;
  tableType_t local_42c;
  BYTE *local_428;
  U32 local_41c;
  undefined8 local_418;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U32 local_3f4;
  undefined8 local_3f0;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U32 local_3cc;
  undefined8 local_3c8;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  uint local_3a4;
  undefined8 local_3a0;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  uint local_37c;
  undefined8 local_378;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  uint local_354;
  undefined8 local_350;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  uint local_32c;
  undefined8 local_328;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  uint local_304;
  undefined8 local_300;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  uint local_2dc;
  undefined8 local_2d8;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  uint local_2b4;
  undefined8 local_2b0;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  uint local_28c;
  undefined8 local_288;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  uint local_264;
  undefined8 local_260;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  uint local_23c;
  undefined8 local_238;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  uint local_214;
  undefined8 local_210;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  uint local_1ec;
  undefined8 local_1e8;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  uint local_1c4;
  undefined8 local_1c0;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  uint local_19c;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  undefined8 local_170;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  uint local_14c;
  undefined8 local_148;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  uint local_124;
  undefined8 local_120;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  uint local_fc;
  tableType_t local_e0;
  U32 local_dc;
  uint local_d8;
  tableType_t local_d4;
  U32 local_d0;
  uint local_cc;
  tableType_t local_c8;
  U32 local_c4;
  uint local_c0;
  tableType_t local_bc;
  U32 local_b8;
  uint local_b4;
  tableType_t local_b0;
  U32 local_ac;
  uint local_a8;
  tableType_t local_a4;
  U32 local_a0;
  uint local_9c;
  tableType_t local_98;
  U32 local_94;
  uint local_90;
  tableType_t local_8c;
  U32 local_88;
  uint local_84;
  tableType_t local_80;
  U32 local_7c;
  uint local_78;
  tableType_t local_74;
  U32 local_70;
  uint local_6c;
  tableType_t local_68;
  U32 local_64;
  uint local_60;
  tableType_t local_5c;
  U32 local_58;
  uint local_54;
  tableType_t local_50;
  U32 local_4c;
  uint local_48;
  tableType_t local_44;
  U32 local_40;
  uint local_3c;
  int local_38;
  U32 local_34;
  uint local_30;
  tableType_t local_2c;
  U32 local_28;
  uint local_24;
  tableType_t local_20;
  U32 local_1c;
  uint local_18;
  
  ctx.table[0x803]._4_4_ = acceleration;
  local_f18 = dstCapacity;
  acceleration_local = srcSize;
  _dstCapacity_local = (BYTE *)dst;
  dst_local = src;
  LZ4_initStream(&local_4f40,0x4020);
  if (acceleration_local < 0x1000b) {
    local_c38 = &local_4f40;
    lowLimit = (BYTE *)(dst_local + -(ulong)ctx.internal_donotuse.hashTable[0xffe]);
    dictEnd._0_4_ = ctx.internal_donotuse.hashTable[0xffe] - ctx._16400_4_;
    anchor = (BYTE *)(ctx.table[0x800] + (uint)ctx.table[0x802]._0_4_);
    mflimitPlusOne = (BYTE *)(dst_local + acceleration_local);
    matchlimit = mflimitPlusOne + -0xb;
    dictBase = mflimitPlusOne + -5;
    op = (BYTE *)((ctx.table[0x800] + (uint)ctx.table[0x802]._0_4_) -
                 (ulong)ctx.internal_donotuse.hashTable[0xffe]);
    _forwardH = _dstCapacity_local + local_f18;
    if ((uint)acceleration_local < 0x7e000001) {
      if (acceleration_local < 0x1000b) {
        dictCtx = (LZ4_stream_t_internal *)dst_local;
        ctx.table[0x802]._0_4_ = acceleration_local + ctx.table[0x802]._0_4_;
        local_c40 = (LZ4_stream_t_internal *)dst_local;
        local_c48 = _dstCapacity_local;
        local_c4c = acceleration_local;
        local_c58 = (int *)0x0;
        local_c5c = local_f18;
        local_c60 = 1;
        local_c64 = byU16;
        local_c68 = 0;
        result = 0;
        local_c70 = ctx.table[0x803]._4_4_;
        pBStack_c80 = (BYTE *)dst_local;
        base._4_4_ = ctx.internal_donotuse.hashTable[0xffe];
        dictionary = ctx.internal_donotuse.dictionary;
        _dictDelta = (LZ4_stream_t_internal *)ctx.table[0x800];
        prefixIdxLimit = 0;
        dictEnd._4_4_ = 0;
        iend = (BYTE *)dst_local;
        olimit = _dstCapacity_local;
        match._4_4_ = 0;
        ctx.table[0x7ff]._6_2_ = 3;
        if (0xc < acceleration_local) {
          local_bc0 = dst_local;
          local_bcc = 3;
          local_b08 = dst_local;
          local_b0c = 3;
          ppBStack_bd8 = (BYTE **)lowLimit;
          local_bc8 = local_c38;
          local_34 = LZ4_read32(dst_local);
          if (local_b0c == 3) {
            local_30 = local_34 * -0x61c8864f >> 0x13;
          }
          else {
            local_30 = local_34 * -0x61c8864f >> 0x14;
          }
          local_38 = local_b0c;
          local_b00 = local_30;
          local_bdc = local_30;
          local_920 = local_bc0;
          local_924 = local_30;
          local_930 = local_bc8;
          local_934 = local_bcc;
          hashTable = ppBStack_bd8;
          switch(local_bcc) {
          case 0:
            break;
          case 1:
            hashTable_1 = local_bc8;
            *(char **)(local_bc8 + (ulong)local_30 * 2) = local_bc0;
            break;
          case 2:
            hashTable_2 = (U16 *)local_bc8;
            local_bc8[local_30] = (int)local_bc0 - (int)ppBStack_bd8;
            break;
          case 3:
            local_958 = local_bc8;
            *(short *)((long)local_bc8 + (ulong)local_30 * 2) =
                 (short)local_bc0 - (short)ppBStack_bd8;
          }
          pBStack_c80 = pBStack_c80 + 1;
          local_a8c = local_c64;
          local_a88 = pBStack_c80;
          if (local_c64 == byU16) {
            local_94 = LZ4_read32(pBStack_c80);
            local_98 = local_a8c;
            if (local_a8c == byU16) {
              local_90 = local_94 * -0x61c8864f >> 0x13;
            }
            else {
              local_90 = local_94 * -0x61c8864f >> 0x14;
            }
            local_a80 = local_90;
          }
          else {
            _hashLog_1 = LZ4_read_ARCH(pBStack_c80);
            prime5bytes_1._4_4_ = local_a8c;
            prime5bytes_1._0_4_ = 0xc;
            if (local_a8c == byU16) {
              prime5bytes_1._0_4_ = 0xd;
            }
            uVar3 = LZ4_isLittleEndian();
            if (uVar3 == 0) {
              local_2d8 = 0x9e3779b185ebca87;
              local_2b4 = (uint)((_hashLog_1 >> 0x18) * -0x61c8864e7a143579 >>
                                (0x40U - (char)(undefined4)prime5bytes_1 & 0x3f));
            }
            else {
              prime8bytes_1 = 0xcf1bbcdcbb;
              local_2b4 = (uint)(_hashLog_1 * -0x30e4432345000000 >>
                                (0x40U - (char)(undefined4)prime5bytes_1 & 0x3f));
            }
            local_a80 = local_2b4;
          }
          match._0_4_ = local_a80;
LAB_00131fb7:
          if (local_c64 == byPtr) {
            _searchMatchNb = pBStack_c80;
            h_1 = 1;
            local_d28 = local_c70 << 6;
            do {
              forwardIp_1._4_4_ = (uint)match;
              pBStack_c80 = _searchMatchNb;
              _searchMatchNb = _searchMatchNb + (int)h_1;
              iVar8 = local_d28 + 1;
              h_1 = local_d28 >> 6;
              local_d28 = iVar8;
              if (matchlimit < _searchMatchNb) goto LAB_001346c6;
              token = LZ4_getPositionOnHash((uint)match,local_c38,local_c64,lowLimit);
              local_ad8 = _searchMatchNb;
              local_adc = local_c64;
              if (local_c64 == byU16) {
                local_58 = LZ4_read32(_searchMatchNb);
                local_5c = local_adc;
                if (local_adc == byU16) {
                  local_54 = local_58 * -0x61c8864f >> 0x13;
                }
                else {
                  local_54 = local_58 * -0x61c8864f >> 0x14;
                }
                local_ad0 = local_54;
              }
              else {
                _hashLog_2 = LZ4_read_ARCH(_searchMatchNb);
                prime5bytes_2._4_4_ = local_adc;
                prime5bytes_2._0_4_ = 0xc;
                if (local_adc == byU16) {
                  prime5bytes_2._0_4_ = 0xd;
                }
                uVar3 = LZ4_isLittleEndian();
                if (uVar3 == 0) {
                  local_210 = 0x9e3779b185ebca87;
                  local_1ec = (uint)((_hashLog_2 >> 0x18) * -0x61c8864e7a143579 >>
                                    (0x40U - (char)(undefined4)prime5bytes_2 & 0x3f));
                }
                else {
                  prime8bytes_2 = 0xcf1bbcdcbb;
                  local_1ec = (uint)(_hashLog_2 * -0x30e4432345000000 >>
                                    (0x40U - (char)(undefined4)prime5bytes_2 & 0x3f));
                }
                local_ad0 = local_1ec;
              }
              match._0_4_ = local_ad0;
              local_860 = pBStack_c80;
              local_864 = forwardIp_1._4_4_;
              local_870 = local_c38;
              local_874 = local_c64;
              hashTable_3 = (BYTE **)lowLimit;
              switch(local_c64) {
              case clearedTable:
                break;
              case byPtr:
                hashTable_4 = local_c38;
                *(BYTE **)(local_c38 + (ulong)forwardIp_1._4_4_ * 2) = pBStack_c80;
                break;
              case byU32:
                hashTable_5 = (U16 *)local_c38;
                local_c38[forwardIp_1._4_4_] = (int)pBStack_c80 - (int)lowLimit;
                break;
              case byU16:
                local_898 = local_c38;
                *(short *)((long)local_c38 + (ulong)forwardIp_1._4_4_ * 2) =
                     (short)pBStack_c80 - (short)lowLimit;
              }
              bVar10 = true;
              if (pBStack_c80 <= token + 0xffff) {
                UVar4 = LZ4_read32(token);
                UVar5 = LZ4_read32(pBStack_c80);
                bVar10 = UVar4 != UVar5;
              }
            } while (bVar10);
          }
          else {
            _searchMatchNb_1 = pBStack_c80;
            h_2 = 1;
            current = local_c70 << 6;
            do {
              do {
                matchIndex = (uint)match;
                litLength = (int)_searchMatchNb_1 - (int)lowLimit;
                local_780 = (uint)match;
                local_788 = local_c38;
                hashTable_6._4_4_ = local_c64;
                if (local_c64 == byU32) {
                  hashTable_7 = (U16 *)local_c38;
                  local_77c = local_c38[(uint)match];
                }
                else if (local_c64 == byU16) {
                  local_7a0 = local_c38;
                  local_77c = (uint)*(ushort *)((long)local_c38 + (ulong)(uint)match * 2);
                }
                else {
                  local_77c = 0;
                }
                len = local_77c;
                pBStack_c80 = _searchMatchNb_1;
                _searchMatchNb_1 = _searchMatchNb_1 + (int)h_2;
                UVar4 = current + 1;
                h_2 = (int)current >> 6;
                current = UVar4;
                if (matchlimit < _searchMatchNb_1) goto LAB_001346c6;
                if (local_c68 == 3) {
                  if (local_77c < base._4_4_) {
                    local_7f8 = (uint)match;
                    local_800 = dictionary;
                    hashTable_8._4_4_ = 2;
                    local_7f4 = *(uint *)(dictionary + (ulong)(uint)match * 4);
                    token = op + local_7f4;
                    len = prefixIdxLimit + local_7f4;
                    dictCtx = _dictDelta;
                  }
                  else {
                    token = lowLimit + local_77c;
                    dictCtx = local_c40;
                  }
                }
                else if (local_c68 == 2) {
                  if (local_77c < base._4_4_) {
                    token = op + local_77c;
                    dictCtx = _dictDelta;
                  }
                  else {
                    token = lowLimit + local_77c;
                    dictCtx = local_c40;
                  }
                }
                else {
                  token = lowLimit + local_77c;
                }
                local_a9c = local_c64;
                local_a98 = _searchMatchNb_1;
                if (local_c64 == byU16) {
                  local_88 = LZ4_read32(_searchMatchNb_1);
                  local_8c = local_a9c;
                  if (local_a9c == byU16) {
                    local_84 = local_88 * -0x61c8864f >> 0x13;
                  }
                  else {
                    local_84 = local_88 * -0x61c8864f >> 0x14;
                  }
                  local_a90 = local_84;
                }
                else {
                  _hashLog_3 = LZ4_read_ARCH(_searchMatchNb_1);
                  prime5bytes_3._4_4_ = local_a9c;
                  prime5bytes_3._0_4_ = 0xc;
                  if (local_a9c == byU16) {
                    prime5bytes_3._0_4_ = 0xd;
                  }
                  uVar3 = LZ4_isLittleEndian();
                  if (uVar3 == 0) {
                    local_2b0 = 0x9e3779b185ebca87;
                    local_28c = (uint)((_hashLog_3 >> 0x18) * -0x61c8864e7a143579 >>
                                      (0x40U - (char)(undefined4)prime5bytes_3 & 0x3f));
                  }
                  else {
                    prime8bytes_3 = 0xcf1bbcdcbb;
                    local_28c = (uint)(_hashLog_3 * -0x30e4432345000000 >>
                                      (0x40U - (char)(undefined4)prime5bytes_3 & 0x3f));
                  }
                  local_a90 = local_28c;
                }
                match._0_4_ = local_a90;
                local_68c = litLength;
                local_690 = matchIndex;
                local_698 = local_c38;
                hashTable_10._4_4_ = local_c64;
                if (byPtr < local_c64) {
                  if (local_c64 == byU32) {
                    hashTable_11 = (U16 *)local_c38;
                    local_c38[matchIndex] = litLength;
                  }
                  else if (local_c64 == byU16) {
                    local_6b0 = local_c38;
                    *(short *)((long)local_c38 + (ulong)matchIndex * 2) = (short)litLength;
                  }
                }
              } while (((result == 1) && ((uint)len < (uint)dictEnd)) ||
                      ((local_c64 != byU16 && (len + 0xffffU < litLength))));
              UVar4 = LZ4_read32(token);
              UVar5 = LZ4_read32(pBStack_c80);
            } while (UVar4 != UVar5);
            if (dictEnd._4_4_ != 0) {
              match._4_4_ = litLength - len;
            }
          }
          forwardIp = pBStack_c80;
          while( true ) {
            bVar10 = false;
            if (iend < pBStack_c80 && dictCtx < token) {
              bVar10 = pBStack_c80[-1] == token[-1];
            }
            if (!bVar10) break;
            pBStack_c80 = pBStack_c80 + -1;
            token = token + -1;
          }
          matchCode = (int)pBStack_c80 - (int)iend;
          pBVar9 = olimit + 1;
          filledIp = olimit;
          if ((local_c60 == 1) &&
             (_forwardH < pBVar9 + (ulong)matchCode / 0xff + (ulong)matchCode + 8)) {
            return 0;
          }
          if ((local_c60 != 2) ||
             (pBVar9 + (ulong)matchCode + (ulong)(matchCode + 0xf0) / 0xff + 0xb <= _forwardH)) {
            if (matchCode < 0xf) {
              *olimit = (char)matchCode * '\x10';
              olimit = pBVar9;
            }
            else {
              *olimit = 0xf0;
              olimit = pBVar9;
              for (limit._4_4_ = matchCode - 0xf; 0xfe < limit._4_4_;
                  limit._4_4_ = limit._4_4_ + -0xff) {
                *olimit = 0xff;
                olimit = olimit + 1;
              }
              *olimit = (BYTE)limit._4_4_;
              olimit = olimit + 1;
            }
            LZ4_wildCopy8(olimit,iend,olimit + matchCode);
            olimit = olimit + matchCode;
LAB_00132b0b:
            do {
              if ((local_c60 == 2) && (_forwardH < olimit + 0xb)) {
                olimit = filledIp;
                break;
              }
              if (dictEnd._4_4_ == 0) {
                LZ4_writeLE16(olimit,(short)pBStack_c80 - (short)token);
              }
              else {
                LZ4_writeLE16(olimit,(U16)match._4_4_);
              }
              olimit = olimit + 2;
              if (((local_c68 == 2) || (local_c68 == 3)) && (dictCtx == _dictDelta)) {
                _newMatchCode = pBStack_c80 + ((long)anchor - (long)token);
                if (dictBase < _newMatchCode) {
                  _newMatchCode = dictBase;
                }
                diff = (reg_t)(pBStack_c80 + 4);
                local_5e0 = token + 4;
                pStart = _newMatchCode;
                local_5d8 = (BYTE *)diff;
                if (diff < _newMatchCode + -7) {
                  rVar6 = LZ4_read_ARCH(local_5e0);
                  rVar7 = LZ4_read_ARCH(local_5d8);
                  diff_1 = rVar6 ^ rVar7;
                  if (diff_1 == 0) {
                    local_5d8 = local_5d8 + 8;
                    local_5e0 = local_5e0 + 8;
                    goto LAB_00132cef;
                  }
                  local_5cc = LZ4_NbCommonBytes(diff_1);
                }
                else {
LAB_00132cef:
                  for (; local_5d8 < pStart + -7; local_5d8 = local_5d8 + 8) {
                    rVar6 = LZ4_read_ARCH(local_5e0);
                    rVar7 = LZ4_read_ARCH(local_5d8);
                    local_600 = rVar6 ^ rVar7;
                    if (local_600 != 0) {
                      uVar3 = LZ4_NbCommonBytes(local_600);
                      local_5d8 = local_5d8 + uVar3;
                      local_5cc = (int)local_5d8 - (int)diff;
                      goto LAB_00132ed5;
                    }
                    local_5e0 = local_5e0 + 8;
                  }
                  if (local_5d8 < pStart + -3) {
                    UVar4 = LZ4_read32(local_5e0);
                    UVar5 = LZ4_read32(local_5d8);
                    if (UVar4 == UVar5) {
                      local_5d8 = local_5d8 + 4;
                      local_5e0 = local_5e0 + 4;
                    }
                  }
                  if (local_5d8 < pStart + -1) {
                    UVar1 = LZ4_read16(local_5e0);
                    UVar2 = LZ4_read16(local_5d8);
                    if (UVar1 == UVar2) {
                      local_5d8 = local_5d8 + 2;
                      local_5e0 = local_5e0 + 2;
                    }
                  }
                  if ((local_5d8 < pStart) && (*local_5e0 == *local_5d8)) {
                    local_5d8 = local_5d8 + 1;
                  }
                  local_5cc = (int)local_5d8 - (int)diff;
                }
LAB_00132ed5:
                limit._0_4_ = local_5cc;
                pBStack_c80 = pBStack_c80 + (ulong)local_5cc + 4;
                if (pBStack_c80 == _newMatchCode) {
                  local_610 = _newMatchCode;
                  local_618 = local_c40;
                  pStart_1 = dictBase;
                  diff_2 = (reg_t)_newMatchCode;
                  if (_newMatchCode < dictBase + -7) {
                    rVar6 = LZ4_read_ARCH(local_c40);
                    rVar7 = LZ4_read_ARCH(local_610);
                    diff_3 = rVar6 ^ rVar7;
                    if (diff_3 == 0) {
                      local_610 = local_610 + 8;
                      local_618 = (LZ4_stream_t_internal *)(local_618->hashTable + 2);
                      goto LAB_00132fdf;
                    }
                    local_604 = LZ4_NbCommonBytes(diff_3);
                  }
                  else {
LAB_00132fdf:
                    for (; local_610 < pStart_1 + -7; local_610 = local_610 + 8) {
                      rVar6 = LZ4_read_ARCH(local_618);
                      rVar7 = LZ4_read_ARCH(local_610);
                      local_638 = rVar6 ^ rVar7;
                      if (local_638 != 0) {
                        uVar3 = LZ4_NbCommonBytes(local_638);
                        local_610 = local_610 + uVar3;
                        local_604 = (int)local_610 - (int)diff_2;
                        goto LAB_001331c5;
                      }
                      local_618 = (LZ4_stream_t_internal *)(local_618->hashTable + 2);
                    }
                    if (local_610 < pStart_1 + -3) {
                      UVar4 = LZ4_read32(local_618);
                      UVar5 = LZ4_read32(local_610);
                      if (UVar4 == UVar5) {
                        local_610 = local_610 + 4;
                        local_618 = (LZ4_stream_t_internal *)(local_618->hashTable + 1);
                      }
                    }
                    if (local_610 < pStart_1 + -1) {
                      UVar1 = LZ4_read16(local_618);
                      UVar2 = LZ4_read16(local_610);
                      if (UVar1 == UVar2) {
                        local_610 = local_610 + 2;
                        local_618 = (LZ4_stream_t_internal *)((long)local_618->hashTable + 2);
                      }
                    }
                    if ((local_610 < pStart_1) && ((BYTE)local_618->hashTable[0] == *local_610)) {
                      local_610 = local_610 + 1;
                    }
                    local_604 = (int)local_610 - (int)diff_2;
                  }
LAB_001331c5:
                  ptr._4_4_ = local_604;
                  limit._0_4_ = local_604 + (uint)limit;
                  pBStack_c80 = pBStack_c80 + local_604;
                }
              }
              else {
                diff_4 = (reg_t)(pBStack_c80 + 4);
                local_5a8 = token + 4;
                pStart_2 = dictBase;
                local_5a0 = (BYTE *)diff_4;
                if (diff_4 < dictBase + -7) {
                  rVar6 = LZ4_read_ARCH(local_5a8);
                  rVar7 = LZ4_read_ARCH(local_5a0);
                  diff_5 = rVar6 ^ rVar7;
                  if (diff_5 == 0) {
                    local_5a0 = local_5a0 + 8;
                    local_5a8 = local_5a8 + 8;
                    goto LAB_001332db;
                  }
                  local_594 = LZ4_NbCommonBytes(diff_5);
                }
                else {
LAB_001332db:
                  for (; local_5a0 < pStart_2 + -7; local_5a0 = local_5a0 + 8) {
                    rVar6 = LZ4_read_ARCH(local_5a8);
                    rVar7 = LZ4_read_ARCH(local_5a0);
                    local_5c8 = rVar6 ^ rVar7;
                    if (local_5c8 != 0) {
                      uVar3 = LZ4_NbCommonBytes(local_5c8);
                      local_5a0 = local_5a0 + uVar3;
                      local_594 = (int)local_5a0 - (int)diff_4;
                      goto LAB_001334c1;
                    }
                    local_5a8 = local_5a8 + 8;
                  }
                  if (local_5a0 < pStart_2 + -3) {
                    UVar4 = LZ4_read32(local_5a8);
                    UVar5 = LZ4_read32(local_5a0);
                    if (UVar4 == UVar5) {
                      local_5a0 = local_5a0 + 4;
                      local_5a8 = local_5a8 + 4;
                    }
                  }
                  if (local_5a0 < pStart_2 + -1) {
                    UVar1 = LZ4_read16(local_5a8);
                    UVar2 = LZ4_read16(local_5a0);
                    if (UVar1 == UVar2) {
                      local_5a0 = local_5a0 + 2;
                      local_5a8 = local_5a8 + 2;
                    }
                  }
                  if ((local_5a0 < pStart_2) && (*local_5a8 == *local_5a0)) {
                    local_5a0 = local_5a0 + 1;
                  }
                  local_594 = (int)local_5a0 - (int)diff_4;
                }
LAB_001334c1:
                limit._0_4_ = local_594;
                pBStack_c80 = pBStack_c80 + (ulong)local_594 + 4;
              }
              if ((local_c60 != 0) && (_forwardH < olimit + (ulong)((uint)limit + 0xf0) / 0xff + 6))
              {
                if (local_c60 != 2) {
                  return 0;
                }
                ptr._0_4_ = (((int)_forwardH - (int)olimit) + -6) * 0xff + 0xe;
                pBStack_c80 = pBStack_c80 + -(ulong)((uint)limit - (uint)ptr);
                pBVar9 = pBStack_c80;
                limit._0_4_ = (uint)ptr;
                if (pBStack_c80 <= forwardIp) {
                  while (_h_7 = pBVar9, _h_7 <= forwardIp) {
                    local_ac8 = _h_7;
                    local_acc = local_c64;
                    if (local_c64 == byU16) {
                      local_64 = LZ4_read32(_h_7);
                      local_68 = local_acc;
                      if (local_acc == byU16) {
                        local_60 = local_64 * -0x61c8864f >> 0x13;
                      }
                      else {
                        local_60 = local_64 * -0x61c8864f >> 0x14;
                      }
                      local_ac0 = local_60;
                    }
                    else {
                      _hashLog_4 = LZ4_read_ARCH(_h_7);
                      prime5bytes_4._4_4_ = local_acc;
                      prime5bytes_4._0_4_ = 0xc;
                      if (local_acc == byU16) {
                        prime5bytes_4._0_4_ = 0xd;
                      }
                      uVar3 = LZ4_isLittleEndian();
                      if (uVar3 == 0) {
                        local_238 = 0x9e3779b185ebca87;
                        local_214 = (uint)((_hashLog_4 >> 0x18) * -0x61c8864e7a143579 >>
                                          (0x40U - (char)(undefined4)prime5bytes_4 & 0x3f));
                      }
                      else {
                        prime8bytes_4 = 0xcf1bbcdcbb;
                        local_214 = (uint)(_hashLog_4 * -0x30e4432345000000 >>
                                          (0x40U - (char)(undefined4)prime5bytes_4 & 0x3f));
                      }
                      local_ac0 = local_214;
                    }
                    current_1 = local_ac0;
                    local_4bc = local_ac0;
                    local_4c8 = local_c38;
                    hashTable_12._4_4_ = local_c64;
                    switch(local_c64) {
                    default:
                      break;
                    case byPtr:
                      hashTable_13 = local_c38;
                      (local_c38 + (ulong)local_ac0 * 2)[0] = 0;
                      (local_c38 + (ulong)local_ac0 * 2)[1] = 0;
                      break;
                    case byU32:
                      hashTable_14 = (U16 *)local_c38;
                      local_c38[local_ac0] = 0;
                      break;
                    case byU16:
                      local_4e8 = local_c38;
                      *(undefined2 *)((long)local_c38 + (ulong)local_ac0 * 2) = 0;
                    }
                    pBVar9 = _h_7 + 1;
                  }
                }
              }
              if ((uint)limit < 0xf) {
                *filledIp = *filledIp + (char)(uint)limit;
              }
              else {
                *filledIp = *filledIp + '\x0f';
                limit._0_4_ = (uint)limit - 0xf;
                LZ4_write32(olimit,0xffffffff);
                for (; 0x3fb < (uint)limit; limit._0_4_ = (uint)limit - 0x3fc) {
                  olimit = olimit + 4;
                  LZ4_write32(olimit,0xffffffff);
                }
                pBVar9 = olimit + (ulong)(uint)limit / 0xff;
                olimit = pBVar9 + 1;
                *pBVar9 = (BYTE)((ulong)(uint)limit % 0xff);
              }
              iend = pBStack_c80;
              if (matchlimit <= pBStack_c80) break;
              local_be8 = pBStack_c80 + -2;
              local_bf0 = local_c38;
              local_bf4 = local_c64;
              ppBStack_c00 = (BYTE **)lowLimit;
              local_afc = local_c64;
              local_af8 = local_be8;
              if (local_c64 == byU16) {
                local_40 = LZ4_read32(local_be8);
                local_44 = local_afc;
                if (local_afc == byU16) {
                  local_3c = local_40 * -0x61c8864f >> 0x13;
                }
                else {
                  local_3c = local_40 * -0x61c8864f >> 0x14;
                }
                local_af0 = local_3c;
              }
              else {
                _hashLog_5 = LZ4_read_ARCH(local_be8);
                prime5bytes_5._4_4_ = local_afc;
                prime5bytes_5._0_4_ = 0xc;
                if (local_afc == byU16) {
                  prime5bytes_5._0_4_ = 0xd;
                }
                uVar3 = LZ4_isLittleEndian();
                if (uVar3 == 0) {
                  local_1c0 = 0x9e3779b185ebca87;
                  local_19c = (uint)((_hashLog_5 >> 0x18) * -0x61c8864e7a143579 >>
                                    (0x40U - (char)(undefined4)prime5bytes_5 & 0x3f));
                }
                else {
                  prime8bytes_5 = 0xcf1bbcdcbb;
                  local_19c = (uint)(_hashLog_5 * -0x30e4432345000000 >>
                                    (0x40U - (char)(undefined4)prime5bytes_5 & 0x3f));
                }
                local_af0 = local_19c;
              }
              local_c04 = local_af0;
              local_8e0 = local_be8;
              local_8e4 = local_af0;
              local_8f0 = local_bf0;
              local_8f4 = local_bf4;
              hashTable_15 = ppBStack_c00;
              switch(local_bf4) {
              case clearedTable:
                break;
              case byPtr:
                hashTable_16 = local_bf0;
                *(BYTE **)(local_bf0 + (ulong)local_af0 * 2) = local_be8;
                break;
              case byU32:
                hashTable_17 = (U16 *)local_bf0;
                local_bf0[local_af0] = (int)local_be8 - (int)ppBStack_c00;
                break;
              case byU16:
                local_918 = local_bf0;
                *(short *)((long)local_bf0 + (ulong)local_af0 * 2) =
                     (short)local_be8 - (short)ppBStack_c00;
              }
              if (local_c64 != byPtr) {
                local_aa8 = pBStack_c80;
                local_aac = local_c64;
                if (local_c64 == byU16) {
                  local_7c = LZ4_read32(pBStack_c80);
                  local_80 = local_aac;
                  if (local_aac == byU16) {
                    local_78 = local_7c * -0x61c8864f >> 0x13;
                  }
                  else {
                    local_78 = local_7c * -0x61c8864f >> 0x14;
                  }
                  local_aa0 = local_78;
                }
                else {
                  _hashLog_8 = LZ4_read_ARCH(pBStack_c80);
                  prime5bytes_8._4_4_ = local_aac;
                  prime5bytes_8._0_4_ = 0xc;
                  if (local_aac == byU16) {
                    prime5bytes_8._0_4_ = 0xd;
                  }
                  uVar3 = LZ4_isLittleEndian();
                  if (uVar3 == 0) {
                    local_288 = 0x9e3779b185ebca87;
                    local_264 = (uint)((_hashLog_8 >> 0x18) * -0x61c8864e7a143579 >>
                                      (0x40U - (char)(undefined4)prime5bytes_8 & 0x3f));
                  }
                  else {
                    prime8bytes_8 = 0xcf1bbcdcbb;
                    local_264 = (uint)(_hashLog_8 * -0x30e4432345000000 >>
                                      (0x40U - (char)(undefined4)prime5bytes_8 & 0x3f));
                  }
                  local_aa0 = local_264;
                }
                matchIndex_1 = local_aa0;
                lastRun._4_4_ = (int)pBStack_c80 - (int)lowLimit;
                local_7a8 = local_aa0;
                local_7b0 = local_c38;
                hashTable_21._4_4_ = local_c64;
                if (local_c64 == byU32) {
                  hashTable_22 = (U16 *)local_c38;
                  local_7a4 = local_c38[local_aa0];
                }
                else if (local_c64 == byU16) {
                  local_7c8 = local_c38;
                  local_7a4 = (uint)*(ushort *)((long)local_c38 + (ulong)local_aa0 * 2);
                }
                else {
                  local_7a4 = 0;
                }
                lastRun._0_4_ = local_7a4;
                if (local_c68 == 3) {
                  if (local_7a4 < base._4_4_) {
                    local_7d0 = local_aa0;
                    local_7d8 = dictionary;
                    hashTable_23._4_4_ = 2;
                    local_7cc = *(uint *)(dictionary + (ulong)local_aa0 * 4);
                    token = op + local_7cc;
                    dictCtx = _dictDelta;
                    lastRun._0_4_ = prefixIdxLimit + local_7cc;
                  }
                  else {
                    token = lowLimit + local_7a4;
                    dictCtx = local_c40;
                  }
                }
                else if (local_c68 == 2) {
                  if (local_7a4 < base._4_4_) {
                    token = op + local_7a4;
                    dictCtx = _dictDelta;
                  }
                  else {
                    token = lowLimit + local_7a4;
                    dictCtx = local_c40;
                  }
                }
                else {
                  token = lowLimit + local_7a4;
                }
                local_6b8 = local_aa0;
                local_6c0 = local_c38;
                hashTable_25._4_4_ = local_c64;
                if (byPtr < local_c64) {
                  if (local_c64 == byU32) {
                    hashTable_26 = (U16 *)local_c38;
                    local_c38[local_aa0] = lastRun._4_4_;
                  }
                  else if (local_c64 == byU16) {
                    local_6d8 = local_c38;
                    *(short *)((long)local_c38 + (ulong)local_aa0 * 2) = (short)lastRun._4_4_;
                  }
                }
                local_6b4 = lastRun._4_4_;
                if (((result == 1) && ((uint)lastRun < (uint)dictEnd)) ||
                   ((local_c64 != byU16 && ((uint)lastRun + 0xffff < lastRun._4_4_))))
                goto LAB_00134566;
                UVar4 = LZ4_read32(token);
                UVar5 = LZ4_read32(pBStack_c80);
                if (UVar4 != UVar5) goto LAB_00134566;
                pBVar9 = olimit + 1;
                filledIp = olimit;
                *olimit = '\0';
                olimit = pBVar9;
                if (dictEnd._4_4_ != 0) {
                  match._4_4_ = lastRun._4_4_ - (uint)lastRun;
                }
                goto LAB_00132b0b;
              }
              local_470 = pBStack_c80;
              local_478 = local_c38;
              local_47c = local_c64;
              pBStack_488 = lowLimit;
              local_460 = pBStack_c80;
              local_464 = local_c64;
              _hashLog_6 = LZ4_read_ARCH(pBStack_c80);
              prime5bytes_6._4_4_ = local_464;
              prime5bytes_6._0_4_ = 0xc;
              if (local_464 == byU16) {
                prime5bytes_6._0_4_ = 0xd;
              }
              uVar3 = LZ4_isLittleEndian();
              if (uVar3 == 0) {
                local_3f0 = 0x9e3779b185ebca87;
                local_3cc = (U32)((_hashLog_6 >> 0x18) * -0x61c8864e7a143579 >>
                                 (0x40U - (char)(undefined4)prime5bytes_6 & 0x3f));
              }
              else {
                prime8bytes_6 = 0xcf1bbcdcbb;
                local_3cc = (U32)(_hashLog_6 * -0x30e4432345000000 >>
                                 (0x40U - (char)(undefined4)prime5bytes_6 & 0x3f));
              }
              local_458 = local_3cc;
              local_48c = local_3cc;
              token = LZ4_getPositionOnHash(local_3cc,local_478,local_47c,pBStack_488);
              local_c10 = pBStack_c80;
              local_c18 = local_c38;
              local_c1c = local_c64;
              ppBStack_c28 = (BYTE **)lowLimit;
              local_ae8 = pBStack_c80;
              local_aec = local_c64;
              if (local_c64 == byU16) {
                local_4c = LZ4_read32(pBStack_c80);
                local_50 = local_aec;
                if (local_aec == byU16) {
                  local_48 = local_4c * -0x61c8864f >> 0x13;
                }
                else {
                  local_48 = local_4c * -0x61c8864f >> 0x14;
                }
                local_ae0 = local_48;
              }
              else {
                _hashLog_7 = LZ4_read_ARCH(pBStack_c80);
                prime5bytes_7._4_4_ = local_aec;
                prime5bytes_7._0_4_ = 0xc;
                if (local_aec == byU16) {
                  prime5bytes_7._0_4_ = 0xd;
                }
                uVar3 = LZ4_isLittleEndian();
                if (uVar3 == 0) {
                  local_1e8 = 0x9e3779b185ebca87;
                  local_1c4 = (uint)((_hashLog_7 >> 0x18) * -0x61c8864e7a143579 >>
                                    (0x40U - (char)(undefined4)prime5bytes_7 & 0x3f));
                }
                else {
                  prime8bytes_7 = 0xcf1bbcdcbb;
                  local_1c4 = (uint)(_hashLog_7 * -0x30e4432345000000 >>
                                    (0x40U - (char)(undefined4)prime5bytes_7 & 0x3f));
                }
                local_ae0 = local_1c4;
              }
              local_c2c = local_ae0;
              local_8a0 = local_c10;
              local_8a4 = local_ae0;
              local_8b0 = local_c18;
              local_8b4 = local_c1c;
              hashTable_18 = ppBStack_c28;
              switch(local_c1c) {
              case clearedTable:
                break;
              case byPtr:
                hashTable_19 = local_c18;
                *(BYTE **)(local_c18 + (ulong)local_ae0 * 2) = local_c10;
                break;
              case byU32:
                hashTable_20 = (U16 *)local_c18;
                local_c18[local_ae0] = (int)local_c10 - (int)ppBStack_c28;
                break;
              case byU16:
                local_8d8 = local_c18;
                *(short *)((long)local_c18 + (ulong)local_ae0 * 2) =
                     (short)local_c10 - (short)ppBStack_c28;
              }
              if (token + 0xffff < pBStack_c80) goto LAB_00134566;
              UVar4 = LZ4_read32(token);
              UVar5 = LZ4_read32(pBStack_c80);
              if (UVar4 != UVar5) goto LAB_00134566;
              filledIp = olimit;
              *olimit = '\0';
              olimit = olimit + 1;
            } while( true );
          }
        }
LAB_001346c6:
        accumulator = (long)mflimitPlusOne - (long)iend;
        if ((local_c60 != 0) && (_forwardH < olimit + (accumulator + 0xf0) / 0xff + accumulator + 1)
           ) {
          if (local_c60 != 2) {
            return 0;
          }
          accumulator = (size_t)(_forwardH +
                                ((-1 - (long)olimit) -
                                (ulong)(_forwardH + (0xef - (long)olimit)) / 0xff));
        }
        if (accumulator < 0xf) {
          *olimit = (BYTE)(accumulator << 4);
          olimit = olimit + 1;
        }
        else {
          local_d90 = accumulator - 0xf;
          *olimit = 0xf0;
          pBVar9 = olimit;
          for (; olimit = pBVar9 + 1, 0xfe < local_d90; local_d90 = local_d90 - 0xff) {
            *olimit = 0xff;
            pBVar9 = olimit;
          }
          *olimit = (BYTE)local_d90;
          olimit = pBVar9 + 2;
        }
        memcpy(olimit,iend,accumulator);
        if (local_c60 == 2) {
          *local_c58 = ((int)iend + (int)accumulator) - (int)local_c40;
        }
        local_c30 = ((int)accumulator + (int)olimit) - (int)local_c48;
      }
      else {
        local_c30 = 0;
      }
    }
    else {
      local_c30 = 0;
    }
    return local_c30;
  }
  local_da0 = &local_4f40;
  lowLimit_1 = (BYTE *)(dst_local + -(ulong)ctx.internal_donotuse.hashTable[0xffe]);
  dictEnd_1._0_4_ = ctx.internal_donotuse.hashTable[0xffe] - ctx._16400_4_;
  anchor_1 = (BYTE *)(ctx.table[0x800] + (uint)ctx.table[0x802]._0_4_);
  mflimitPlusOne_1 = (BYTE *)(dst_local + acceleration_local);
  matchlimit_1 = mflimitPlusOne_1 + -0xb;
  dictBase_1 = mflimitPlusOne_1 + -5;
  op_1 = (BYTE *)((ctx.table[0x800] + (uint)ctx.table[0x802]._0_4_) -
                 (ulong)ctx.internal_donotuse.hashTable[0xffe]);
  _forwardH_1 = _dstCapacity_local + local_f18;
  if ((uint)acceleration_local < 0x7e000001) {
    dictCtx_1 = (LZ4_stream_t_internal *)dst_local;
    ctx.table[0x802]._0_4_ = acceleration_local + ctx.table[0x802]._0_4_;
    local_da8 = (LZ4_stream_t_internal *)dst_local;
    local_db0 = _dstCapacity_local;
    local_db4 = acceleration_local;
    local_dc0 = (int *)0x0;
    local_dc4 = local_f18;
    local_dc8 = 1;
    local_dcc = byU32;
    local_dd0 = 0;
    result_1 = 0;
    local_dd8 = ctx.table[0x803]._4_4_;
    pBStack_de8 = (BYTE *)dst_local;
    base_1._4_4_ = ctx.internal_donotuse.hashTable[0xffe];
    dictionary_1 = ctx.internal_donotuse.dictionary;
    _dictDelta_1 = (LZ4_stream_t_internal *)ctx.table[0x800];
    prefixIdxLimit_1 = 0;
    dictEnd_1._4_4_ = 0;
    iend_1 = (BYTE *)dst_local;
    olimit_1 = _dstCapacity_local;
    match_1._4_4_ = 0;
    ctx.table[0x7ff]._6_2_ = 2;
    if (0xc < acceleration_local) {
      local_b48 = dst_local;
      local_b54 = 2;
      local_b38 = dst_local;
      local_b3c = 2;
      ppBStack_b60 = (BYTE **)lowLimit_1;
      local_b50 = local_da0;
      _hashLog_10 = LZ4_read_ARCH(dst_local);
      prime5bytes_10._4_4_ = local_b3c;
      prime5bytes_10._0_4_ = 0xc;
      if (local_b3c == 3) {
        prime5bytes_10._0_4_ = 0xd;
      }
      uVar3 = LZ4_isLittleEndian();
      if (uVar3 == 0) {
        local_120 = 0x9e3779b185ebca87;
        local_fc = (uint)((_hashLog_10 >> 0x18) * -0x61c8864e7a143579 >>
                         (0x40U - (char)(undefined4)prime5bytes_10 & 0x3f));
      }
      else {
        prime8bytes_10 = 0xcf1bbcdcbb;
        local_fc = (uint)(_hashLog_10 * -0x30e4432345000000 >>
                         (0x40U - (char)(undefined4)prime5bytes_10 & 0x3f));
      }
      local_b30 = local_fc;
      local_b64 = local_fc;
      local_9e0 = local_b48;
      local_9e4 = local_fc;
      local_9f0 = local_b50;
      local_9f4 = local_b54;
      hashTable_27 = ppBStack_b60;
      switch(local_b54) {
      case 0:
        break;
      case 1:
        hashTable_28 = local_b50;
        *(char **)(local_b50 + (ulong)local_fc * 2) = local_b48;
        break;
      case 2:
        hashTable_29 = (U16 *)local_b50;
        local_b50[local_fc] = (int)local_b48 - (int)ppBStack_b60;
        break;
      case 3:
        local_a18 = local_b50;
        *(short *)((long)local_b50 + (ulong)local_fc * 2) = (short)local_b48 - (short)ppBStack_b60;
      }
      pBStack_de8 = pBStack_de8 + 1;
      local_a2c = local_dcc;
      local_a28 = pBStack_de8;
      if (local_dcc == byU16) {
        local_dc = LZ4_read32(pBStack_de8);
        local_e0 = local_a2c;
        if (local_a2c == byU16) {
          local_d8 = local_dc * -0x61c8864f >> 0x13;
        }
        else {
          local_d8 = local_dc * -0x61c8864f >> 0x14;
        }
        local_a1c = local_d8;
      }
      else {
        _hashLog_11 = LZ4_read_ARCH(pBStack_de8);
        prime5bytes_11._4_4_ = local_a2c;
        prime5bytes_11._0_4_ = 0xc;
        if (local_a2c == byU16) {
          prime5bytes_11._0_4_ = 0xd;
        }
        uVar3 = LZ4_isLittleEndian();
        if (uVar3 == 0) {
          local_3c8 = 0x9e3779b185ebca87;
          local_3a4 = (uint)((_hashLog_11 >> 0x18) * -0x61c8864e7a143579 >>
                            (0x40U - (char)(undefined4)prime5bytes_11 & 0x3f));
        }
        else {
          prime8bytes_11 = 0xcf1bbcdcbb;
          local_3a4 = (uint)(_hashLog_11 * -0x30e4432345000000 >>
                            (0x40U - (char)(undefined4)prime5bytes_11 & 0x3f));
        }
        local_a1c = local_3a4;
      }
      match_1._0_4_ = local_a1c;
LAB_00135110:
      if (local_dcc == byPtr) {
        _searchMatchNb_2 = pBStack_de8;
        h_9 = 1;
        local_e90 = local_dd8 << 6;
        do {
          forwardIp_3._4_4_ = (uint)match_1;
          pBStack_de8 = _searchMatchNb_2;
          _searchMatchNb_2 = _searchMatchNb_2 + (int)h_9;
          iVar8 = local_e90 + 1;
          h_9 = local_e90 >> 6;
          local_e90 = iVar8;
          if (matchlimit_1 < _searchMatchNb_2) goto LAB_00137891;
          token_1 = LZ4_getPositionOnHash((uint)match_1,local_da0,local_dcc,lowLimit_1);
          local_a78 = _searchMatchNb_2;
          local_a7c = local_dcc;
          if (local_dcc == byU16) {
            local_a0 = LZ4_read32(_searchMatchNb_2);
            local_a4 = local_a7c;
            if (local_a7c == byU16) {
              local_9c = local_a0 * -0x61c8864f >> 0x13;
            }
            else {
              local_9c = local_a0 * -0x61c8864f >> 0x14;
            }
            local_a70 = local_9c;
          }
          else {
            _hashLog_12 = LZ4_read_ARCH(_searchMatchNb_2);
            prime5bytes_12._4_4_ = local_a7c;
            prime5bytes_12._0_4_ = 0xc;
            if (local_a7c == byU16) {
              prime5bytes_12._0_4_ = 0xd;
            }
            uVar3 = LZ4_isLittleEndian();
            if (uVar3 == 0) {
              local_300 = 0x9e3779b185ebca87;
              local_2dc = (uint)((_hashLog_12 >> 0x18) * -0x61c8864e7a143579 >>
                                (0x40U - (char)(undefined4)prime5bytes_12 & 0x3f));
            }
            else {
              prime8bytes_12 = 0xcf1bbcdcbb;
              local_2dc = (uint)(_hashLog_12 * -0x30e4432345000000 >>
                                (0x40U - (char)(undefined4)prime5bytes_12 & 0x3f));
            }
            local_a70 = local_2dc;
          }
          match_1._0_4_ = local_a70;
          local_820 = pBStack_de8;
          local_824 = forwardIp_3._4_4_;
          local_830 = local_da0;
          local_834 = local_dcc;
          hashTable_30 = (BYTE **)lowLimit_1;
          switch(local_dcc) {
          case clearedTable:
            break;
          case byPtr:
            hashTable_31 = local_da0;
            *(BYTE **)(local_da0 + (ulong)forwardIp_3._4_4_ * 2) = pBStack_de8;
            break;
          case byU32:
            hashTable_32 = (U16 *)local_da0;
            local_da0[forwardIp_3._4_4_] = (int)pBStack_de8 - (int)lowLimit_1;
            break;
          case byU16:
            local_858 = local_da0;
            *(short *)((long)local_da0 + (ulong)forwardIp_3._4_4_ * 2) =
                 (short)pBStack_de8 - (short)lowLimit_1;
          }
          bVar10 = true;
          if (pBStack_de8 <= token_1 + 0xffff) {
            UVar4 = LZ4_read32(token_1);
            UVar5 = LZ4_read32(pBStack_de8);
            bVar10 = UVar4 != UVar5;
          }
        } while (bVar10);
      }
      else {
        _searchMatchNb_3 = pBStack_de8;
        h_10 = 1;
        current_2 = local_dd8 << 6;
        do {
          do {
            matchIndex_2 = (uint)match_1;
            litLength_1 = (int)_searchMatchNb_3 - (int)lowLimit_1;
            local_6e0 = (uint)match_1;
            local_6e8 = local_da0;
            hashTable_33._4_4_ = local_dcc;
            if (local_dcc == byU32) {
              hashTable_34 = (U16 *)local_da0;
              local_6dc = local_da0[(uint)match_1];
            }
            else if (local_dcc == byU16) {
              local_700 = local_da0;
              local_6dc = (uint)*(ushort *)((long)local_da0 + (ulong)(uint)match_1 * 2);
            }
            else {
              local_6dc = 0;
            }
            len_1 = local_6dc;
            pBStack_de8 = _searchMatchNb_3;
            _searchMatchNb_3 = _searchMatchNb_3 + (int)h_10;
            UVar4 = current_2 + 1;
            h_10 = (int)current_2 >> 6;
            current_2 = UVar4;
            if (matchlimit_1 < _searchMatchNb_3) goto LAB_00137891;
            if (local_dd0 == 3) {
              if (local_6dc < base_1._4_4_) {
                local_758 = (uint)match_1;
                local_760 = dictionary_1;
                hashTable_35._4_4_ = 2;
                local_754 = *(uint *)(dictionary_1 + (ulong)(uint)match_1 * 4);
                token_1 = op_1 + local_754;
                len_1 = prefixIdxLimit_1 + local_754;
                dictCtx_1 = _dictDelta_1;
              }
              else {
                token_1 = lowLimit_1 + local_6dc;
                dictCtx_1 = local_da8;
              }
            }
            else if (local_dd0 == 2) {
              if (local_6dc < base_1._4_4_) {
                token_1 = op_1 + local_6dc;
                dictCtx_1 = _dictDelta_1;
              }
              else {
                token_1 = lowLimit_1 + local_6dc;
                dictCtx_1 = local_da8;
              }
            }
            else {
              token_1 = lowLimit_1 + local_6dc;
            }
            local_a3c = local_dcc;
            local_a38 = _searchMatchNb_3;
            if (local_dcc == byU16) {
              local_d0 = LZ4_read32(_searchMatchNb_3);
              local_d4 = local_a3c;
              if (local_a3c == byU16) {
                local_cc = local_d0 * -0x61c8864f >> 0x13;
              }
              else {
                local_cc = local_d0 * -0x61c8864f >> 0x14;
              }
              local_a30 = local_cc;
            }
            else {
              _hashLog_13 = LZ4_read_ARCH(_searchMatchNb_3);
              prime5bytes_13._4_4_ = local_a3c;
              prime5bytes_13._0_4_ = 0xc;
              if (local_a3c == byU16) {
                prime5bytes_13._0_4_ = 0xd;
              }
              uVar3 = LZ4_isLittleEndian();
              if (uVar3 == 0) {
                local_3a0 = 0x9e3779b185ebca87;
                local_37c = (uint)((_hashLog_13 >> 0x18) * -0x61c8864e7a143579 >>
                                  (0x40U - (char)(undefined4)prime5bytes_13 & 0x3f));
              }
              else {
                prime8bytes_13 = 0xcf1bbcdcbb;
                local_37c = (uint)(_hashLog_13 * -0x30e4432345000000 >>
                                  (0x40U - (char)(undefined4)prime5bytes_13 & 0x3f));
              }
              local_a30 = local_37c;
            }
            match_1._0_4_ = local_a30;
            local_63c = litLength_1;
            local_640 = matchIndex_2;
            local_648 = local_da0;
            hashTable_37._4_4_ = local_dcc;
            if (byPtr < local_dcc) {
              if (local_dcc == byU32) {
                hashTable_38 = (U16 *)local_da0;
                local_da0[matchIndex_2] = litLength_1;
              }
              else if (local_dcc == byU16) {
                local_660 = local_da0;
                *(short *)((long)local_da0 + (ulong)matchIndex_2 * 2) = (short)litLength_1;
              }
            }
          } while (((result_1 == 1) && ((uint)len_1 < (uint)dictEnd_1)) ||
                  ((local_dcc != byU16 && (len_1 + 0xffffU < litLength_1))));
          UVar4 = LZ4_read32(token_1);
          UVar5 = LZ4_read32(pBStack_de8);
        } while (UVar4 != UVar5);
        if (dictEnd_1._4_4_ != 0) {
          match_1._4_4_ = litLength_1 - len_1;
        }
      }
      forwardIp_2 = pBStack_de8;
      while( true ) {
        bVar10 = false;
        if (iend_1 < pBStack_de8 && dictCtx_1 < token_1) {
          bVar10 = pBStack_de8[-1] == token_1[-1];
        }
        if (!bVar10) break;
        pBStack_de8 = pBStack_de8 + -1;
        token_1 = token_1 + -1;
      }
      matchCode_1 = (int)pBStack_de8 - (int)iend_1;
      pBVar9 = olimit_1 + 1;
      filledIp_1 = olimit_1;
      if ((local_dc8 == 1) &&
         (_forwardH_1 < pBVar9 + (ulong)matchCode_1 / 0xff + (ulong)matchCode_1 + 8)) {
        return 0;
      }
      if ((local_dc8 != 2) ||
         (pBVar9 + (ulong)matchCode_1 + (ulong)(matchCode_1 + 0xf0) / 0xff + 0xb <= _forwardH_1)) {
        if (matchCode_1 < 0xf) {
          *olimit_1 = (char)matchCode_1 * '\x10';
          olimit_1 = pBVar9;
        }
        else {
          *olimit_1 = 0xf0;
          olimit_1 = pBVar9;
          for (limit_1._4_4_ = matchCode_1 - 0xf; 0xfe < limit_1._4_4_;
              limit_1._4_4_ = limit_1._4_4_ + -0xff) {
            *olimit_1 = 0xff;
            olimit_1 = olimit_1 + 1;
          }
          *olimit_1 = (BYTE)limit_1._4_4_;
          olimit_1 = olimit_1 + 1;
        }
        LZ4_wildCopy8(olimit_1,iend_1,olimit_1 + matchCode_1);
        olimit_1 = olimit_1 + matchCode_1;
LAB_00135c8e:
        do {
          if ((local_dc8 == 2) && (_forwardH_1 < olimit_1 + 0xb)) {
            olimit_1 = filledIp_1;
            break;
          }
          if (dictEnd_1._4_4_ == 0) {
            LZ4_writeLE16(olimit_1,(short)pBStack_de8 - (short)token_1);
          }
          else {
            LZ4_writeLE16(olimit_1,(U16)match_1._4_4_);
          }
          olimit_1 = olimit_1 + 2;
          if (((local_dd0 == 2) || (local_dd0 == 3)) && (dictCtx_1 == _dictDelta_1)) {
            _newMatchCode_1 = pBStack_de8 + ((long)anchor_1 - (long)token_1);
            if (dictBase_1 < _newMatchCode_1) {
              _newMatchCode_1 = dictBase_1;
            }
            diff_6 = (reg_t)(pBStack_de8 + 4);
            local_538 = token_1 + 4;
            pStart_3 = _newMatchCode_1;
            local_530 = (BYTE *)diff_6;
            if (diff_6 < _newMatchCode_1 + -7) {
              rVar6 = LZ4_read_ARCH(local_538);
              rVar7 = LZ4_read_ARCH(local_530);
              diff_7 = rVar6 ^ rVar7;
              if (diff_7 == 0) {
                local_530 = local_530 + 8;
                local_538 = local_538 + 8;
                goto LAB_00135e72;
              }
              local_524 = LZ4_NbCommonBytes(diff_7);
            }
            else {
LAB_00135e72:
              for (; local_530 < pStart_3 + -7; local_530 = local_530 + 8) {
                rVar6 = LZ4_read_ARCH(local_538);
                rVar7 = LZ4_read_ARCH(local_530);
                local_558 = rVar6 ^ rVar7;
                if (local_558 != 0) {
                  uVar3 = LZ4_NbCommonBytes(local_558);
                  local_530 = local_530 + uVar3;
                  local_524 = (int)local_530 - (int)diff_6;
                  goto LAB_00136058;
                }
                local_538 = local_538 + 8;
              }
              if (local_530 < pStart_3 + -3) {
                UVar4 = LZ4_read32(local_538);
                UVar5 = LZ4_read32(local_530);
                if (UVar4 == UVar5) {
                  local_530 = local_530 + 4;
                  local_538 = local_538 + 4;
                }
              }
              if (local_530 < pStart_3 + -1) {
                UVar1 = LZ4_read16(local_538);
                UVar2 = LZ4_read16(local_530);
                if (UVar1 == UVar2) {
                  local_530 = local_530 + 2;
                  local_538 = local_538 + 2;
                }
              }
              if ((local_530 < pStart_3) && (*local_538 == *local_530)) {
                local_530 = local_530 + 1;
              }
              local_524 = (int)local_530 - (int)diff_6;
            }
LAB_00136058:
            limit_1._0_4_ = local_524;
            pBStack_de8 = pBStack_de8 + (ulong)local_524 + 4;
            if (pBStack_de8 == _newMatchCode_1) {
              local_568 = _newMatchCode_1;
              local_570 = local_da8;
              pStart_4 = dictBase_1;
              diff_8 = (reg_t)_newMatchCode_1;
              if (_newMatchCode_1 < dictBase_1 + -7) {
                rVar6 = LZ4_read_ARCH(local_da8);
                rVar7 = LZ4_read_ARCH(local_568);
                diff_9 = rVar6 ^ rVar7;
                if (diff_9 == 0) {
                  local_568 = local_568 + 8;
                  local_570 = (LZ4_stream_t_internal *)(local_570->hashTable + 2);
                  goto LAB_00136162;
                }
                local_55c = LZ4_NbCommonBytes(diff_9);
              }
              else {
LAB_00136162:
                for (; local_568 < pStart_4 + -7; local_568 = local_568 + 8) {
                  rVar6 = LZ4_read_ARCH(local_570);
                  rVar7 = LZ4_read_ARCH(local_568);
                  local_590 = rVar6 ^ rVar7;
                  if (local_590 != 0) {
                    uVar3 = LZ4_NbCommonBytes(local_590);
                    local_568 = local_568 + uVar3;
                    local_55c = (int)local_568 - (int)diff_8;
                    goto LAB_00136348;
                  }
                  local_570 = (LZ4_stream_t_internal *)(local_570->hashTable + 2);
                }
                if (local_568 < pStart_4 + -3) {
                  UVar4 = LZ4_read32(local_570);
                  UVar5 = LZ4_read32(local_568);
                  if (UVar4 == UVar5) {
                    local_568 = local_568 + 4;
                    local_570 = (LZ4_stream_t_internal *)(local_570->hashTable + 1);
                  }
                }
                if (local_568 < pStart_4 + -1) {
                  UVar1 = LZ4_read16(local_570);
                  UVar2 = LZ4_read16(local_568);
                  if (UVar1 == UVar2) {
                    local_568 = local_568 + 2;
                    local_570 = (LZ4_stream_t_internal *)((long)local_570->hashTable + 2);
                  }
                }
                if ((local_568 < pStart_4) && ((BYTE)local_570->hashTable[0] == *local_568)) {
                  local_568 = local_568 + 1;
                }
                local_55c = (int)local_568 - (int)diff_8;
              }
LAB_00136348:
              ptr_1._4_4_ = local_55c;
              limit_1._0_4_ = local_55c + (uint)limit_1;
              pBStack_de8 = pBStack_de8 + local_55c;
            }
          }
          else {
            diff_10 = (reg_t)(pBStack_de8 + 4);
            local_500 = token_1 + 4;
            pStart_5 = dictBase_1;
            local_4f8 = (BYTE *)diff_10;
            if (diff_10 < dictBase_1 + -7) {
              rVar6 = LZ4_read_ARCH(local_500);
              rVar7 = LZ4_read_ARCH(local_4f8);
              diff_11 = rVar6 ^ rVar7;
              if (diff_11 == 0) {
                local_4f8 = local_4f8 + 8;
                local_500 = local_500 + 8;
                goto LAB_0013645e;
              }
              local_4ec = LZ4_NbCommonBytes(diff_11);
            }
            else {
LAB_0013645e:
              for (; local_4f8 < pStart_5 + -7; local_4f8 = local_4f8 + 8) {
                rVar6 = LZ4_read_ARCH(local_500);
                rVar7 = LZ4_read_ARCH(local_4f8);
                local_520 = rVar6 ^ rVar7;
                if (local_520 != 0) {
                  uVar3 = LZ4_NbCommonBytes(local_520);
                  local_4f8 = local_4f8 + uVar3;
                  local_4ec = (int)local_4f8 - (int)diff_10;
                  goto LAB_00136644;
                }
                local_500 = local_500 + 8;
              }
              if (local_4f8 < pStart_5 + -3) {
                UVar4 = LZ4_read32(local_500);
                UVar5 = LZ4_read32(local_4f8);
                if (UVar4 == UVar5) {
                  local_4f8 = local_4f8 + 4;
                  local_500 = local_500 + 4;
                }
              }
              if (local_4f8 < pStart_5 + -1) {
                UVar1 = LZ4_read16(local_500);
                UVar2 = LZ4_read16(local_4f8);
                if (UVar1 == UVar2) {
                  local_4f8 = local_4f8 + 2;
                  local_500 = local_500 + 2;
                }
              }
              if ((local_4f8 < pStart_5) && (*local_500 == *local_4f8)) {
                local_4f8 = local_4f8 + 1;
              }
              local_4ec = (int)local_4f8 - (int)diff_10;
            }
LAB_00136644:
            limit_1._0_4_ = local_4ec;
            pBStack_de8 = pBStack_de8 + (ulong)local_4ec + 4;
          }
          if ((local_dc8 != 0) &&
             (_forwardH_1 < olimit_1 + (ulong)((uint)limit_1 + 0xf0) / 0xff + 6)) {
            if (local_dc8 != 2) {
              return 0;
            }
            ptr_1._0_4_ = (((int)_forwardH_1 - (int)olimit_1) + -6) * 0xff + 0xe;
            pBStack_de8 = pBStack_de8 + -(ulong)((uint)limit_1 - (uint)ptr_1);
            pBVar9 = pBStack_de8;
            limit_1._0_4_ = (uint)ptr_1;
            if (pBStack_de8 <= forwardIp_2) {
              while (_h_15 = pBVar9, _h_15 <= forwardIp_2) {
                local_a68 = _h_15;
                local_a6c = local_dcc;
                if (local_dcc == byU16) {
                  local_ac = LZ4_read32(_h_15);
                  local_b0 = local_a6c;
                  if (local_a6c == byU16) {
                    local_a8 = local_ac * -0x61c8864f >> 0x13;
                  }
                  else {
                    local_a8 = local_ac * -0x61c8864f >> 0x14;
                  }
                  local_a60 = local_a8;
                }
                else {
                  _hashLog_14 = LZ4_read_ARCH(_h_15);
                  prime5bytes_14._4_4_ = local_a6c;
                  prime5bytes_14._0_4_ = 0xc;
                  if (local_a6c == byU16) {
                    prime5bytes_14._0_4_ = 0xd;
                  }
                  uVar3 = LZ4_isLittleEndian();
                  if (uVar3 == 0) {
                    local_328 = 0x9e3779b185ebca87;
                    local_304 = (uint)((_hashLog_14 >> 0x18) * -0x61c8864e7a143579 >>
                                      (0x40U - (char)(undefined4)prime5bytes_14 & 0x3f));
                  }
                  else {
                    prime8bytes_14 = 0xcf1bbcdcbb;
                    local_304 = (uint)(_hashLog_14 * -0x30e4432345000000 >>
                                      (0x40U - (char)(undefined4)prime5bytes_14 & 0x3f));
                  }
                  local_a60 = local_304;
                }
                current_3 = local_a60;
                local_490 = local_a60;
                local_498 = local_da0;
                hashTable_39._4_4_ = local_dcc;
                switch(local_dcc) {
                default:
                  break;
                case byPtr:
                  hashTable_40 = local_da0;
                  (local_da0 + (ulong)local_a60 * 2)[0] = 0;
                  (local_da0 + (ulong)local_a60 * 2)[1] = 0;
                  break;
                case byU32:
                  hashTable_41 = (U16 *)local_da0;
                  local_da0[local_a60] = 0;
                  break;
                case byU16:
                  local_4b8 = local_da0;
                  *(undefined2 *)((long)local_da0 + (ulong)local_a60 * 2) = 0;
                }
                pBVar9 = _h_15 + 1;
              }
            }
          }
          if ((uint)limit_1 < 0xf) {
            *filledIp_1 = *filledIp_1 + (char)(uint)limit_1;
          }
          else {
            *filledIp_1 = *filledIp_1 + '\x0f';
            limit_1._0_4_ = (uint)limit_1 - 0xf;
            LZ4_write32(olimit_1,0xffffffff);
            for (; 0x3fb < (uint)limit_1; limit_1._0_4_ = (uint)limit_1 - 0x3fc) {
              olimit_1 = olimit_1 + 4;
              LZ4_write32(olimit_1,0xffffffff);
            }
            pBVar9 = olimit_1 + (ulong)(uint)limit_1 / 0xff;
            olimit_1 = pBVar9 + 1;
            *pBVar9 = (BYTE)((ulong)(uint)limit_1 % 0xff);
          }
          iend_1 = pBStack_de8;
          if (matchlimit_1 <= pBStack_de8) break;
          local_b70 = pBStack_de8 + -2;
          local_b78 = local_da0;
          local_b7c = local_dcc;
          ppBStack_b88 = (BYTE **)lowLimit_1;
          local_b2c = local_dcc;
          local_b28 = local_b70;
          if (local_dcc == byU16) {
            local_1c = LZ4_read32(local_b70);
            local_20 = local_b2c;
            if (local_b2c == byU16) {
              local_18 = local_1c * -0x61c8864f >> 0x13;
            }
            else {
              local_18 = local_1c * -0x61c8864f >> 0x14;
            }
            local_b20 = local_18;
          }
          else {
            _hashLog_15 = LZ4_read_ARCH(local_b70);
            prime5bytes_15._4_4_ = local_b2c;
            prime5bytes_15._0_4_ = 0xc;
            if (local_b2c == byU16) {
              prime5bytes_15._0_4_ = 0xd;
            }
            uVar3 = LZ4_isLittleEndian();
            if (uVar3 == 0) {
              local_148 = 0x9e3779b185ebca87;
              local_124 = (uint)((_hashLog_15 >> 0x18) * -0x61c8864e7a143579 >>
                                (0x40U - (char)(undefined4)prime5bytes_15 & 0x3f));
            }
            else {
              prime8bytes_15 = 0xcf1bbcdcbb;
              local_124 = (uint)(_hashLog_15 * -0x30e4432345000000 >>
                                (0x40U - (char)(undefined4)prime5bytes_15 & 0x3f));
            }
            local_b20 = local_124;
          }
          local_b8c = local_b20;
          local_9a0 = local_b70;
          local_9a4 = local_b20;
          local_9b0 = local_b78;
          local_9b4 = local_b7c;
          hashTable_42 = ppBStack_b88;
          switch(local_b7c) {
          case clearedTable:
            break;
          case byPtr:
            hashTable_43 = local_b78;
            *(BYTE **)(local_b78 + (ulong)local_b20 * 2) = local_b70;
            break;
          case byU32:
            hashTable_44 = (U16 *)local_b78;
            local_b78[local_b20] = (int)local_b70 - (int)ppBStack_b88;
            break;
          case byU16:
            local_9d8 = local_b78;
            *(short *)((long)local_b78 + (ulong)local_b20 * 2) =
                 (short)local_b70 - (short)ppBStack_b88;
          }
          if (local_dcc != byPtr) {
            local_a48 = pBStack_de8;
            local_a4c = local_dcc;
            if (local_dcc == byU16) {
              local_c4 = LZ4_read32(pBStack_de8);
              local_c8 = local_a4c;
              if (local_a4c == byU16) {
                local_c0 = local_c4 * -0x61c8864f >> 0x13;
              }
              else {
                local_c0 = local_c4 * -0x61c8864f >> 0x14;
              }
              local_a40 = local_c0;
            }
            else {
              _hashLog_18 = LZ4_read_ARCH(pBStack_de8);
              prime5bytes_18._4_4_ = local_a4c;
              prime5bytes_18._0_4_ = 0xc;
              if (local_a4c == byU16) {
                prime5bytes_18._0_4_ = 0xd;
              }
              uVar3 = LZ4_isLittleEndian();
              if (uVar3 == 0) {
                local_378 = 0x9e3779b185ebca87;
                local_354 = (uint)((_hashLog_18 >> 0x18) * -0x61c8864e7a143579 >>
                                  (0x40U - (char)(undefined4)prime5bytes_18 & 0x3f));
              }
              else {
                prime8bytes_18 = 0xcf1bbcdcbb;
                local_354 = (uint)(_hashLog_18 * -0x30e4432345000000 >>
                                  (0x40U - (char)(undefined4)prime5bytes_18 & 0x3f));
              }
              local_a40 = local_354;
            }
            matchIndex_3 = local_a40;
            lastRun_1._4_4_ = (int)pBStack_de8 - (int)lowLimit_1;
            local_708 = local_a40;
            local_710 = local_da0;
            hashTable_48._4_4_ = local_dcc;
            if (local_dcc == byU32) {
              hashTable_49 = (U16 *)local_da0;
              local_704 = local_da0[local_a40];
            }
            else if (local_dcc == byU16) {
              local_728 = local_da0;
              local_704 = (uint)*(ushort *)((long)local_da0 + (ulong)local_a40 * 2);
            }
            else {
              local_704 = 0;
            }
            lastRun_1._0_4_ = local_704;
            if (local_dd0 == 3) {
              if (local_704 < base_1._4_4_) {
                local_730 = local_a40;
                local_738 = dictionary_1;
                hashTable_50._4_4_ = 2;
                local_72c = *(uint *)(dictionary_1 + (ulong)local_a40 * 4);
                token_1 = op_1 + local_72c;
                dictCtx_1 = _dictDelta_1;
                lastRun_1._0_4_ = prefixIdxLimit_1 + local_72c;
              }
              else {
                token_1 = lowLimit_1 + local_704;
                dictCtx_1 = local_da8;
              }
            }
            else if (local_dd0 == 2) {
              if (local_704 < base_1._4_4_) {
                token_1 = op_1 + local_704;
                dictCtx_1 = _dictDelta_1;
              }
              else {
                token_1 = lowLimit_1 + local_704;
                dictCtx_1 = local_da8;
              }
            }
            else {
              token_1 = lowLimit_1 + local_704;
            }
            local_668 = local_a40;
            local_670 = local_da0;
            hashTable_52._4_4_ = local_dcc;
            if (byPtr < local_dcc) {
              if (local_dcc == byU32) {
                hashTable_53 = (U16 *)local_da0;
                local_da0[local_a40] = lastRun_1._4_4_;
              }
              else if (local_dcc == byU16) {
                local_688 = local_da0;
                *(short *)((long)local_da0 + (ulong)local_a40 * 2) = (short)lastRun_1._4_4_;
              }
            }
            local_664 = lastRun_1._4_4_;
            if (((result_1 == 1) && ((uint)lastRun_1 < (uint)dictEnd_1)) ||
               ((local_dcc != byU16 && ((uint)lastRun_1 + 0xffff < lastRun_1._4_4_))))
            goto LAB_00137719;
            UVar4 = LZ4_read32(token_1);
            UVar5 = LZ4_read32(pBStack_de8);
            if (UVar4 != UVar5) goto LAB_00137719;
            pBVar9 = olimit_1 + 1;
            filledIp_1 = olimit_1;
            *olimit_1 = '\0';
            olimit_1 = pBVar9;
            if (dictEnd_1._4_4_ != 0) {
              match_1._4_4_ = lastRun_1._4_4_ - (uint)lastRun_1;
            }
            goto LAB_00135c8e;
          }
          local_438 = pBStack_de8;
          local_440 = local_da0;
          local_444 = local_dcc;
          pBStack_450 = lowLimit_1;
          local_428 = pBStack_de8;
          local_42c = local_dcc;
          _hashLog_16 = LZ4_read_ARCH(pBStack_de8);
          prime5bytes_16._4_4_ = local_42c;
          prime5bytes_16._0_4_ = 0xc;
          if (local_42c == byU16) {
            prime5bytes_16._0_4_ = 0xd;
          }
          uVar3 = LZ4_isLittleEndian();
          if (uVar3 == 0) {
            local_418 = 0x9e3779b185ebca87;
            local_3f4 = (U32)((_hashLog_16 >> 0x18) * -0x61c8864e7a143579 >>
                             (0x40U - (char)(undefined4)prime5bytes_16 & 0x3f));
          }
          else {
            prime8bytes_16 = 0xcf1bbcdcbb;
            local_3f4 = (U32)(_hashLog_16 * -0x30e4432345000000 >>
                             (0x40U - (char)(undefined4)prime5bytes_16 & 0x3f));
          }
          local_41c = local_3f4;
          local_454 = local_3f4;
          token_1 = LZ4_getPositionOnHash(local_3f4,local_440,local_444,pBStack_450);
          local_b98 = pBStack_de8;
          local_ba0 = local_da0;
          local_ba4 = local_dcc;
          ppBStack_bb0 = (BYTE **)lowLimit_1;
          local_b18 = pBStack_de8;
          local_b1c = local_dcc;
          if (local_dcc == byU16) {
            local_28 = LZ4_read32(pBStack_de8);
            local_2c = local_b1c;
            if (local_b1c == byU16) {
              local_24 = local_28 * -0x61c8864f >> 0x13;
            }
            else {
              local_24 = local_28 * -0x61c8864f >> 0x14;
            }
            local_b10 = local_24;
          }
          else {
            _hashLog_17 = LZ4_read_ARCH(pBStack_de8);
            prime5bytes_17._4_4_ = local_b1c;
            prime5bytes_17._0_4_ = 0xc;
            if (local_b1c == byU16) {
              prime5bytes_17._0_4_ = 0xd;
            }
            uVar3 = LZ4_isLittleEndian();
            if (uVar3 == 0) {
              local_170 = 0x9e3779b185ebca87;
              local_14c = (uint)((_hashLog_17 >> 0x18) * -0x61c8864e7a143579 >>
                                (0x40U - (char)(undefined4)prime5bytes_17 & 0x3f));
            }
            else {
              prime8bytes_17 = 0xcf1bbcdcbb;
              local_14c = (uint)(_hashLog_17 * -0x30e4432345000000 >>
                                (0x40U - (char)(undefined4)prime5bytes_17 & 0x3f));
            }
            local_b10 = local_14c;
          }
          local_bb4 = local_b10;
          local_960 = local_b98;
          local_964 = local_b10;
          local_970 = local_ba0;
          local_974 = local_ba4;
          hashTable_45 = ppBStack_bb0;
          switch(local_ba4) {
          case clearedTable:
            break;
          case byPtr:
            hashTable_46 = local_ba0;
            *(BYTE **)(local_ba0 + (ulong)local_b10 * 2) = local_b98;
            break;
          case byU32:
            hashTable_47 = (U16 *)local_ba0;
            local_ba0[local_b10] = (int)local_b98 - (int)ppBStack_bb0;
            break;
          case byU16:
            local_998 = local_ba0;
            *(short *)((long)local_ba0 + (ulong)local_b10 * 2) =
                 (short)local_b98 - (short)ppBStack_bb0;
          }
          if (token_1 + 0xffff < pBStack_de8) goto LAB_00137719;
          UVar4 = LZ4_read32(token_1);
          UVar5 = LZ4_read32(pBStack_de8);
          if (UVar4 != UVar5) goto LAB_00137719;
          filledIp_1 = olimit_1;
          *olimit_1 = '\0';
          olimit_1 = olimit_1 + 1;
        } while( true );
      }
    }
LAB_00137891:
    accumulator_1 = (long)mflimitPlusOne_1 - (long)iend_1;
    if ((local_dc8 != 0) &&
       (_forwardH_1 < olimit_1 + (accumulator_1 + 0xf0) / 0xff + accumulator_1 + 1)) {
      if (local_dc8 != 2) {
        return 0;
      }
      accumulator_1 =
           (size_t)(_forwardH_1 +
                   ((-1 - (long)olimit_1) - (ulong)(_forwardH_1 + (0xef - (long)olimit_1)) / 0xff));
    }
    if (accumulator_1 < 0xf) {
      *olimit_1 = (BYTE)(accumulator_1 << 4);
      olimit_1 = olimit_1 + 1;
    }
    else {
      local_ef8 = accumulator_1 - 0xf;
      *olimit_1 = 0xf0;
      pBVar9 = olimit_1;
      for (; olimit_1 = pBVar9 + 1, 0xfe < local_ef8; local_ef8 = local_ef8 - 0xff) {
        *olimit_1 = 0xff;
        pBVar9 = olimit_1;
      }
      *olimit_1 = (BYTE)local_ef8;
      olimit_1 = pBVar9 + 2;
    }
    memcpy(olimit_1,iend_1,accumulator_1);
    if (local_dc8 == 2) {
      *local_dc0 = ((int)iend_1 + (int)accumulator_1) - (int)local_da8;
    }
    local_d94 = ((int)accumulator_1 + (int)olimit_1) - (int)local_db0;
  }
  else {
    local_d94 = 0;
  }
  return local_d94;
LAB_00134566:
  pBStack_c80 = pBStack_c80 + 1;
  local_abc = local_c64;
  local_ab8 = pBStack_c80;
  if (local_c64 == byU16) {
    local_70 = LZ4_read32(pBStack_c80);
    local_74 = local_abc;
    if (local_abc == byU16) {
      local_6c = local_70 * -0x61c8864f >> 0x13;
    }
    else {
      local_6c = local_70 * -0x61c8864f >> 0x14;
    }
    local_ab0 = local_6c;
  }
  else {
    _hashLog_9 = LZ4_read_ARCH(pBStack_c80);
    prime5bytes_9._4_4_ = local_abc;
    prime5bytes_9._0_4_ = 0xc;
    if (local_abc == byU16) {
      prime5bytes_9._0_4_ = 0xd;
    }
    uVar3 = LZ4_isLittleEndian();
    if (uVar3 == 0) {
      local_260 = 0x9e3779b185ebca87;
      local_23c = (uint)((_hashLog_9 >> 0x18) * -0x61c8864e7a143579 >>
                        (0x40U - (char)(undefined4)prime5bytes_9 & 0x3f));
    }
    else {
      prime8bytes_9 = 0xcf1bbcdcbb;
      local_23c = (uint)(_hashLog_9 * -0x30e4432345000000 >>
                        (0x40U - (char)(undefined4)prime5bytes_9 & 0x3f));
    }
    local_ab0 = local_23c;
  }
  match._0_4_ = local_ab0;
  goto LAB_00131fb7;
LAB_00137719:
  pBStack_de8 = pBStack_de8 + 1;
  local_a5c = local_dcc;
  local_a58 = pBStack_de8;
  if (local_dcc == byU16) {
    local_b8 = LZ4_read32(pBStack_de8);
    local_bc = local_a5c;
    if (local_a5c == byU16) {
      local_b4 = local_b8 * -0x61c8864f >> 0x13;
    }
    else {
      local_b4 = local_b8 * -0x61c8864f >> 0x14;
    }
    local_a50 = local_b4;
  }
  else {
    _hashLog_19 = LZ4_read_ARCH(pBStack_de8);
    prime5bytes_19._4_4_ = local_a5c;
    prime5bytes_19._0_4_ = 0xc;
    if (local_a5c == byU16) {
      prime5bytes_19._0_4_ = 0xd;
    }
    uVar3 = LZ4_isLittleEndian();
    if (uVar3 == 0) {
      local_350 = 0x9e3779b185ebca87;
      local_32c = (uint)((_hashLog_19 >> 0x18) * -0x61c8864e7a143579 >>
                        (0x40U - (char)(undefined4)prime5bytes_19 & 0x3f));
    }
    else {
      prime8bytes_19 = 0xcf1bbcdcbb;
      local_32c = (uint)(_hashLog_19 * -0x30e4432345000000 >>
                        (0x40U - (char)(undefined4)prime5bytes_19 & 0x3f));
    }
    local_a50 = local_32c;
  }
  match_1._0_4_ = local_a50;
  goto LAB_00135110;
}

Assistant:

int LZ4_compress_fast_force(const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t ctx;
    LZ4_initStream(&ctx, sizeof(ctx));

    if (srcSize < LZ4_64Klimit) {
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, byU16,    noDict, noDictIssue, acceleration);
    } else {
        tableType_t const addrMode = (sizeof(void*) > 4) ? byU32 : byPtr;
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, addrMode, noDict, noDictIssue, acceleration);
    }
}